

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O3

string * to_string_abi_cxx11_(string *__return_storage_ptr__,Encoding *encoding)

{
  Encoding EVar1;
  char *pcVar2;
  char *pcVar3;
  
  EVar1 = *encoding;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(EVar1) {
  case MFM:
    pcVar3 = "MFM";
    pcVar2 = "";
    break;
  case FM:
    pcVar3 = "FM";
    pcVar2 = "";
    break;
  case RX02:
    pcVar3 = "RX02";
    pcVar2 = "";
    break;
  case Amiga:
    pcVar3 = "Amiga";
    pcVar2 = "";
    break;
  case GCR:
    pcVar3 = "GCR";
    pcVar2 = "";
    break;
  case Ace:
    pcVar3 = "Ace";
    pcVar2 = "";
    break;
  case MX:
    pcVar3 = "MX";
    pcVar2 = "";
    break;
  case Agat:
    pcVar3 = "Agat";
    pcVar2 = "";
    break;
  case Apple:
    pcVar3 = "Apple";
    pcVar2 = "";
    break;
  case Victor:
    pcVar3 = "Victor";
    pcVar2 = "";
    break;
  case Vista:
    pcVar3 = "Vista";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "Unknown";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const Encoding& encoding)
{
    switch (encoding)
    {
    case Encoding::MFM:     return "MFM";           break;
    case Encoding::FM:      return "FM";            break;
    case Encoding::RX02:    return "RX02";          break;
    case Encoding::Amiga:   return "Amiga";         break;
    case Encoding::GCR:     return "GCR";           break;
    case Encoding::Ace:     return "Ace";           break;
    case Encoding::MX:      return "MX";            break;
    case Encoding::Agat:    return "Agat";          break;
    case Encoding::Apple:   return "Apple";         break;
    case Encoding::Victor:  return "Victor";        break;
    case Encoding::Vista:   return "Vista";         break;
    case Encoding::Unknown: break;
    }
    return "Unknown";
}